

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O1

bool __thiscall
moodycamel::ConcurrentQueue<loop::MessageLoop::TaskInfo_*,_moodycamel::ConcurrentQueueDefaultTraits>
::ImplicitProducer::new_block_index(ImplicitProducer *this)

{
  __pointer_type pBVar1;
  __int_type_conflict _Var2;
  __pointer_type pBVar3;
  BlockIndexEntry *pBVar4;
  BlockIndexEntry **ppBVar5;
  size_t sVar6;
  size_t sVar7;
  __int_type_conflict _Var8;
  BlockIndexEntry *pBVar9;
  size_t sVar10;
  size_t sVar11;
  
  pBVar1 = (this->blockIndex)._M_b._M_p;
  if (pBVar1 == (__pointer_type)0x0) {
    sVar11 = 0;
  }
  else {
    sVar11 = pBVar1->capacity;
  }
  sVar10 = sVar11;
  if (pBVar1 == (__pointer_type)0x0) {
    sVar10 = this->nextBlockIndexCapacity;
  }
  pBVar3 = (__pointer_type)malloc(this->nextBlockIndexCapacity * 8 + 0x36 + sVar10 * 0x10);
  if (pBVar3 != (__pointer_type)0x0) {
    pBVar4 = (BlockIndexEntry *)((long)&pBVar3[1].capacity + (ulong)(-((int)pBVar3 + 0x28) & 7));
    pBVar9 = pBVar4 + sVar10;
    if (pBVar1 != (__pointer_type)0x0) {
      _Var2 = (pBVar1->tail).super___atomic_base<unsigned_long>._M_i;
      sVar7 = pBVar1->capacity;
      sVar6 = 0;
      _Var8 = _Var2;
      do {
        _Var8 = _Var8 + 1 & sVar7 - 1;
        (&pBVar9->key)[sVar6].super___atomic_base<unsigned_long>._M_i =
             (__int_type_conflict)pBVar1->index[_Var8];
        sVar6 = sVar6 + 1;
      } while (_Var8 != _Var2);
      if (sVar11 != sVar6) {
        __assert_fail("i == prevCapacity",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/xutiezhu[P]tqapi/lib/myutils/concurrentqueue.h"
                      ,0xb46,
                      "bool moodycamel::ConcurrentQueue<loop::MessageLoop::TaskInfo *>::ImplicitProducer::new_block_index() [T = loop::MessageLoop::TaskInfo *, Traits = moodycamel::ConcurrentQueueDefaultTraits]"
                     );
      }
    }
    ppBVar5 = (BlockIndexEntry **)
              ((long)&(pBVar9->key).super___atomic_base<unsigned_long>._M_i +
              (ulong)(-(int)pBVar9 & 7));
    if (sVar10 != 0) {
      sVar7 = 0;
      pBVar9 = pBVar4;
      do {
        (pBVar9->key).super___atomic_base<unsigned_long>._M_i = 1;
        ppBVar5[sVar11 + sVar7] = pBVar9;
        sVar7 = sVar7 + 1;
        pBVar9 = pBVar9 + 1;
      } while (sVar10 != sVar7);
    }
    pBVar3->prev = pBVar1;
    pBVar3->entries = pBVar4;
    pBVar3->index = ppBVar5;
    sVar10 = this->nextBlockIndexCapacity;
    pBVar3->capacity = sVar10;
    (pBVar3->tail).super___atomic_base<unsigned_long>._M_i = sVar10 - 1 & sVar11 - 1;
    (this->blockIndex)._M_b._M_p = pBVar3;
    this->nextBlockIndexCapacity = this->nextBlockIndexCapacity << 1;
  }
  return pBVar3 != (__pointer_type)0x0;
}

Assistant:

bool new_block_index()
		{
			auto prev = blockIndex.load(std::memory_order_relaxed);
			size_t prevCapacity = prev == nullptr ? 0 : prev->capacity;
			auto entryCount = prev == nullptr ? nextBlockIndexCapacity : prevCapacity;
			auto raw = static_cast<char*>((Traits::malloc)(
				sizeof(BlockIndexHeader) +
				std::alignment_of<BlockIndexEntry>::value - 1 + sizeof(BlockIndexEntry) * entryCount +
				std::alignment_of<BlockIndexEntry*>::value - 1 + sizeof(BlockIndexEntry*) * nextBlockIndexCapacity));
			if (raw == nullptr) {
				return false;
			}
			
			auto header = new (raw) BlockIndexHeader;
			auto entries = reinterpret_cast<BlockIndexEntry*>(details::align_for<BlockIndexEntry>(raw + sizeof(BlockIndexHeader)));
			auto index = reinterpret_cast<BlockIndexEntry**>(details::align_for<BlockIndexEntry*>(reinterpret_cast<char*>(entries) + sizeof(BlockIndexEntry) * entryCount));
			if (prev != nullptr) {
				auto prevTail = prev->tail.load(std::memory_order_relaxed);
				auto prevPos = prevTail;
				size_t i = 0;
				do {
					prevPos = (prevPos + 1) & (prev->capacity - 1);
					index[i++] = prev->index[prevPos];
				} while (prevPos != prevTail);
				assert(i == prevCapacity);
			}
			for (size_t i = 0; i != entryCount; ++i) {
				new (entries + i) BlockIndexEntry;
				entries[i].key.store(INVALID_BLOCK_BASE, std::memory_order_relaxed);
				index[prevCapacity + i] = entries + i;
			}
			header->prev = prev;
			header->entries = entries;
			header->index = index;
			header->capacity = nextBlockIndexCapacity;
			header->tail.store((prevCapacity - 1) & (nextBlockIndexCapacity - 1), std::memory_order_relaxed);
			
			blockIndex.store(header, std::memory_order_release);
			
			nextBlockIndexCapacity <<= 1;
			
			return true;
		}